

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satVec.h
# Opt level: O2

void solver2_clear_tags(sat_solver3 *s,int start)

{
  int *piVar1;
  long lVar2;
  
  piVar1 = (s->tagged).ptr;
  for (lVar2 = (long)start; lVar2 < (s->tagged).size; lVar2 = lVar2 + 1) {
    s->tags[piVar1[lVar2]] = '\0';
  }
  veci_resize(&s->tagged,start);
  return;
}

Assistant:

static inline int    veci_size   (veci* v)          { return v->size; }